

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_convolution_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  pointer piVar11;
  long lVar12;
  ulong uVar13;
  size_type __n;
  ulong uVar14;
  ulong uVar15;
  size_type sVar16;
  float fVar17;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    uVar13 = lVar12 >> 3;
    lVar12 = 0;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if (iVar8 == 0) {
        uVar15 = lVar12 + 1;
        uVar14 = uVar15;
        if (uVar15 < uVar13) {
          iVar8 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar9 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar15]->type);
            if (((iVar9 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar15],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4)) &&
               (uVar14 = uVar15, *piVar4 == iVar8)) break;
            uVar15 = uVar15 + 1;
            uVar14 = uVar13;
          } while (uVar15 < uVar13);
        }
        if (uVar14 != uVar13) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[lVar12];
          pLVar6 = ppLVar5[uVar14];
          fprintf(_stderr,"fuse_convolution_batchnorm %s %s\n",(pLVar3->name)._M_dataplus._M_p);
          iVar8 = *(int *)&pLVar6[1]._vptr_Layer;
          __n = (size_type)iVar8;
          fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_48,__n,(allocator_type *)&local_a8);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_60,__n,(allocator_type *)&local_a8);
          if (0 < iVar8) {
            sVar16 = 0;
            do {
              fVar17 = (float)pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[sVar16] + fVar1;
              if (fVar17 < 0.0) {
                fVar17 = sqrtf(fVar17);
              }
              else {
                fVar17 = SQRT(fVar17);
              }
              lVar7 = *(long *)&pLVar6[1].one_blob_only;
              local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar16] =
                   *(float *)(*(long *)&pLVar6[2].support_tensor_storage + sVar16 * 4) -
                   (*(float *)(lVar7 + sVar16 * 4) *
                   *(float *)(pLVar6[1].name._M_dataplus._M_p + sVar16 * 4)) / fVar17;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar16] = *(float *)(lVar7 + sVar16 * 4) / fVar17;
              sVar16 = sVar16 + 1;
            } while (__n != sVar16);
          }
          if (*(int *)&pLVar3[1].type._M_dataplus._M_p == 0) {
            *(undefined4 *)&pLVar3[1].type._M_dataplus._M_p = 1;
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            local_a8.allocator = (Allocator *)0x0;
            local_a8.dims = 0;
            local_a8.w = 0;
            ncnn::Mat::create(&local_a8,iVar8,4,(Allocator *)0x0);
            if ((Mat *)&pLVar3[2].one_blob_only != &local_a8) {
              piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[2].support_tensor_storage;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (*(long **)&pLVar3[2].typeindex == (long *)0x0) {
                    if (*(void **)&pLVar3[2].one_blob_only != (void *)0x0) {
                      free(*(void **)&pLVar3[2].one_blob_only);
                    }
                  }
                  else {
                    (**(code **)(**(long **)&pLVar3[2].typeindex + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pLVar3[2].type.field_2 + 8) = 0;
              pLVar3[2].support_reserved_2 = false;
              pLVar3[2].support_reserved_3 = false;
              pLVar3[2].support_reserved_4 = false;
              pLVar3[2].support_reserved_5 = false;
              pLVar3[2].support_reserved_6 = false;
              pLVar3[2].support_reserved_7 = false;
              pLVar3[2].support_reserved_8 = false;
              pLVar3[2].support_reserved_9 = false;
              *(undefined8 *)&pLVar3[2].support_reserved_10 = 0;
              pLVar3[2].one_blob_only = false;
              pLVar3[2].support_inplace = false;
              pLVar3[2].support_vulkan = false;
              pLVar3[2].support_packing = false;
              pLVar3[2].support_bf16_storage = false;
              pLVar3[2].support_fp16_storage = false;
              pLVar3[2].support_int8_storage = false;
              pLVar3[2].support_image_storage = false;
              pLVar3[2].support_tensor_storage = false;
              pLVar3[2].support_reserved_00 = false;
              pLVar3[2].support_reserved_0 = false;
              pLVar3[2].support_reserved_1 = false;
              pLVar3[2].support_reserved_2 = false;
              pLVar3[2].support_reserved_3 = false;
              pLVar3[2].support_reserved_4 = false;
              pLVar3[2].support_reserved_5 = false;
              pLVar3[2].type._M_dataplus._M_p = (pointer)0x0;
              pLVar3[2].type._M_string_length = 0;
              *(undefined4 *)&pLVar3[2].type.field_2 = 0;
              *(void **)&pLVar3[2].one_blob_only = local_a8.data;
              pLVar3[2].support_tensor_storage = (bool)(char)local_a8.refcount._0_4_;
              pLVar3[2].support_reserved_00 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 8);
              pLVar3[2].support_reserved_0 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 0x10);
              pLVar3[2].support_reserved_1 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 0x18);
              pLVar3[2].support_reserved_2 = (bool)(char)local_a8.refcount._4_4_;
              pLVar3[2].support_reserved_3 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 8);
              pLVar3[2].support_reserved_4 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 0x10);
              pLVar3[2].support_reserved_5 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 0x18);
              pLVar3[2].support_reserved_6 = (bool)(char)(undefined4)local_a8.elemsize;
              pLVar3[2].support_reserved_7 = (bool)(char)((uint)(undefined4)local_a8.elemsize >> 8);
              pLVar3[2].support_reserved_8 =
                   (bool)(char)((uint)(undefined4)local_a8.elemsize >> 0x10);
              pLVar3[2].support_reserved_9 =
                   (bool)(char)((uint)(undefined4)local_a8.elemsize >> 0x18);
              pLVar3[2].support_reserved_10 = (bool)(char)local_a8.elemsize._4_4_;
              pLVar3[2].support_reserved_11 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 8);
              pLVar3[2].support_reserved_12 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 0x10);
              pLVar3[2].support_reserved_13 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 0x18);
              *(int *)&pLVar3[2].userdata = local_a8.elempack;
              *(Allocator **)&pLVar3[2].typeindex = local_a8.allocator;
              *(int *)&pLVar3[2].type._M_dataplus._M_p = local_a8.dims;
              *(int *)((long)&pLVar3[2].type._M_dataplus._M_p + 4) = local_a8.w;
              *(int *)&pLVar3[2].type._M_string_length = local_a8.h;
              *(int *)((long)&pLVar3[2].type._M_string_length + 4) = local_a8.d;
              *(int *)&pLVar3[2].type.field_2 = local_a8.c;
              *(size_t *)((long)&pLVar3[2].type.field_2 + 8) = local_a8.cstep;
            }
            piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_a8.allocator == (Allocator *)0x0) {
                  if (local_a8.data != (void *)0x0) {
                    free(local_a8.data);
                  }
                }
                else {
                  (*(local_a8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.dims = 0;
            local_a8.w = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            uVar10 = *(int *)&pLVar3[2].type.field_2 * *(int *)((long)&pLVar3[2].type.field_2 + 8);
            if (0 < (int)uVar10) {
              memset(*(void **)&pLVar3[2].one_blob_only,0,(ulong)uVar10 << 2);
            }
          }
          uVar15 = (long)*(int *)((long)&pLVar3[1].type._M_dataplus._M_p + 4) / (long)iVar8;
          if (0 < iVar8) {
            piVar11 = pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            lVar7 = *(long *)&pLVar3[2].one_blob_only;
            iVar8 = (int)uVar15;
            sVar16 = 0;
            do {
              if (0 < iVar8) {
                uVar14 = 0;
                do {
                  piVar11[uVar14] =
                       (int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[sVar16] * (float)piVar11[uVar14]);
                  uVar14 = uVar14 + 1;
                } while ((uVar15 & 0xffffffff) != uVar14);
              }
              *(float *)(lVar7 + sVar16 * 4) =
                   *(float *)(lVar7 + sVar16 * 4) *
                   local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar16] +
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar16];
              sVar16 = sVar16 + 1;
              piVar11 = piVar11 + iVar8;
            } while (sVar16 != __n);
          }
          if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar8 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar8;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar8].producer = (int)lVar12;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar6->type,0,(char *)(pLVar6->type)._M_string_length,0x55a19a);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != uVar13 + (uVar13 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolution_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BatchNorm to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_convolution_batchnorm %s %s\n", convolution->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (convolution->bias_term == 0)
            {
                // init bias as zero
                convolution->bias_term = 1;
                convolution->bias_data = ncnn::Mat(channels);
                convolution->bias_data.fill(0.f);
            }

            const int weight_per_outch = convolution->weight_data_size / channels;

            float* weight = convolution->weight_data;
            float* bias = convolution->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}